

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O2

int mbedtls_net_recv_timeout(void *ctx,uchar *buf,size_t len,uint32_t timeout)

{
  uint uVar1;
  uint __i;
  int iVar2;
  long lVar3;
  int *piVar4;
  timeval *__timeout;
  timeval tv;
  fd_set read_fds;
  
  uVar1 = *ctx;
  if (-1 < (int)uVar1) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      read_fds.__fds_bits[lVar3] = 0;
    }
    read_fds.__fds_bits[uVar1 >> 6] = read_fds.__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
    tv.tv_sec = (ulong)timeout / 1000;
    tv.tv_usec = (__suseconds_t)((timeout % 1000) * 1000);
    __timeout = &tv;
    if (timeout == 0) {
      __timeout = (timeval *)(timeval *)0x0;
    }
    iVar2 = select(uVar1 + 1,(fd_set *)&read_fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)__timeout);
    if (iVar2 == 0) {
      iVar2 = -0x6800;
    }
    else if (iVar2 < 0) {
      piVar4 = __errno_location();
      iVar2 = -0x4c;
      if (*piVar4 == 4) {
        iVar2 = -0x6900;
      }
    }
    else {
      iVar2 = mbedtls_net_recv(ctx,buf,len);
    }
    return iVar2;
  }
  return -0x45;
}

Assistant:

int mbedtls_net_recv_timeout( void *ctx, unsigned char *buf, size_t len,
                      uint32_t timeout )
{
    int ret;
    struct timeval tv;
    fd_set read_fds;
    int fd = ((mbedtls_net_context *) ctx)->fd;

    if( fd < 0 )
        return( MBEDTLS_ERR_NET_INVALID_CONTEXT );

    FD_ZERO( &read_fds );
    FD_SET( fd, &read_fds );

    tv.tv_sec  = timeout / 1000;
    tv.tv_usec = ( timeout % 1000 ) * 1000;

    ret = select( fd + 1, &read_fds, NULL, NULL, timeout == 0 ? NULL : &tv );

    /* Zero fds ready means we timed out */
    if( ret == 0 )
        return( MBEDTLS_ERR_SSL_TIMEOUT );

    if( ret < 0 )
    {
#if ( defined(_WIN32) || defined(_WIN32_WCE) ) && !defined(EFIX64) && \
    !defined(EFI32)
        if( WSAGetLastError() == WSAEINTR )
            return( MBEDTLS_ERR_SSL_WANT_READ );
#else
        if( errno == EINTR )
            return( MBEDTLS_ERR_SSL_WANT_READ );
#endif

        return( MBEDTLS_ERR_NET_RECV_FAILED );
    }

    /* This call will not block */
    return( mbedtls_net_recv( ctx, buf, len ) );
}